

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseStartTag(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar xVar2;
  xmlChar *pxVar3;
  byte *pbVar4;
  startElementSAXFunc p_Var5;
  int iVar6;
  xmlChar *str2;
  xmlChar **ppxVar7;
  xmlParserInputPtr pxVar8;
  long lVar9;
  xmlChar **ppxVar10;
  long lVar11;
  int local_5c;
  xmlChar *attvalue;
  ulong local_50;
  xmlChar *local_48;
  byte *local_40;
  ulong local_38;
  
  pxVar8 = ctxt->input;
  pxVar3 = pxVar8->cur;
  if (*pxVar3 == '<') {
    ppxVar10 = ctxt->atts;
    local_5c = ctxt->maxatts;
    pxVar8->col = pxVar8->col + 1;
    pxVar8->cur = pxVar3 + 1;
    if (pxVar3[1] == '\0') {
      xmlParserInputGrow(pxVar8,0xfa);
    }
    local_48 = xmlParseName(ctxt);
    if (local_48 != (xmlChar *)0x0) {
      xmlSkipBlankChars(ctxt);
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      local_50 = 0;
      do {
        pbVar4 = ctxt->input->cur;
        bVar1 = *pbVar4;
        if (bVar1 == 0x2f) {
          if (pbVar4[1] == 0x3e) goto LAB_00162e81;
        }
        else if ((bVar1 == 0x3e) || ((1 < (byte)(bVar1 - 9) && (bVar1 != 0xd && bVar1 < 0x20))))
        goto LAB_00162e81;
        if (ctxt->instate == XML_PARSER_EOF) goto LAB_00162e81;
        local_38 = (ulong)(uint)ctxt->input->consumed;
        local_40 = pbVar4;
        str2 = xmlParseAttribute(ctxt,&attvalue);
        pxVar3 = attvalue;
        ppxVar7 = ppxVar10;
        if (attvalue == (xmlChar *)0x0 || str2 == (xmlChar *)0x0) {
          if (attvalue != (xmlChar *)0x0) {
            (*xmlFree)(attvalue);
          }
        }
        else {
          lVar11 = (long)(int)local_50;
          lVar9 = 0;
          do {
            if (lVar11 <= lVar9) {
              if (ppxVar10 == (xmlChar **)0x0) {
                ppxVar7 = (xmlChar **)(*xmlMalloc)(0xb0);
                if (ppxVar7 == (xmlChar **)0x0) {
                  xmlErrMemory(ctxt,(char *)0x0);
                  (*xmlFree)(pxVar3);
                  local_5c = 0x16;
                  ppxVar7 = (xmlChar **)0x0;
                  goto LAB_00162d26;
                }
                local_5c = 0x16;
LAB_00162ceb:
                ctxt->atts = ppxVar7;
                ctxt->maxatts = local_5c;
              }
              else if (local_5c < (int)local_50 + 4) {
                local_5c = local_5c * 2;
                ppxVar7 = (xmlChar **)(*xmlRealloc)(ppxVar10,(long)local_5c << 3);
                if (ppxVar7 != (xmlChar **)0x0) goto LAB_00162ceb;
                xmlErrMemory(ctxt,(char *)0x0);
                goto LAB_00162c60;
              }
              ppxVar7[lVar11] = str2;
              local_50 = (ulong)((int)local_50 + 2);
              ppxVar7[lVar11 + 1] = attvalue;
              ppxVar7[lVar11 + 2] = (xmlChar *)0x0;
              (ppxVar7 + lVar11 + 2)[1] = (xmlChar *)0x0;
              goto LAB_00162d26;
            }
            iVar6 = xmlStrEqual(ppxVar10[lVar9],str2);
            lVar9 = lVar9 + 2;
          } while (iVar6 == 0);
          xmlErrAttributeDup(ctxt,(xmlChar *)0x0,str2);
LAB_00162c60:
          (*xmlFree)(pxVar3);
          ppxVar7 = ppxVar10;
        }
LAB_00162d26:
        pxVar8 = ctxt->input;
        if ((ctxt->progressive == 0) && ((long)pxVar8->end - (long)pxVar8->cur < 0xfa)) {
          xmlGROW(ctxt);
          pxVar8 = ctxt->input;
        }
        xVar2 = *pxVar8->cur;
        if (xVar2 == '/') {
          xVar2 = pxVar8->cur[1];
        }
        ppxVar10 = ppxVar7;
        if (xVar2 == '>') goto LAB_00162e81;
        iVar6 = xmlSkipBlankChars(ctxt);
        if (iVar6 == 0) {
          xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"attributes construct error\n");
        }
        pxVar8 = ctxt->input;
        if ((((local_38 == pxVar8->consumed) && (str2 == (xmlChar *)0x0)) &&
            (local_40 == pxVar8->cur)) && (attvalue == (xmlChar *)0x0)) {
          xmlFatalErrMsg(ctxt,XML_ERR_INTERNAL_ERROR,
                         "xmlParseStartTag: problem parsing attributes\n");
LAB_00162e81:
          if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
              (p_Var5 = ctxt->sax->startElement, p_Var5 != (startElementSAXFunc)0x0)) &&
             (ctxt->disableSAX == 0)) {
            ppxVar7 = (xmlChar **)0x0;
            if (0 < (int)local_50) {
              ppxVar7 = ppxVar10;
            }
            (*p_Var5)(ctxt->userData,local_48,ppxVar7);
          }
          if (ppxVar10 == (xmlChar **)0x0) {
            return local_48;
          }
          lVar9 = (long)(int)local_50;
          for (lVar11 = 1; lVar11 < lVar9; lVar11 = lVar11 + 2) {
            if (ppxVar10[lVar11] != (xmlChar *)0x0) {
              (*xmlFree)(ppxVar10[lVar11]);
            }
          }
          return local_48;
        }
        if ((ctxt->progressive == 0) &&
           (((((long)pxVar8->cur - (long)pxVar8->base < 0x1f5 ||
              (499 < (long)pxVar8->end - (long)pxVar8->cur)) ||
             (xmlSHRINK(ctxt), ctxt->progressive == 0)) &&
            ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)))) {
          xmlGROW(ctxt);
        }
      } while( true );
    }
    xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseStartTag: invalid element name\n");
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlParseStartTag(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *attname;
    xmlChar *attvalue;
    const xmlChar **atts = ctxt->atts;
    int nbatts = 0;
    int maxatts = ctxt->maxatts;
    int i;

    if (RAW != '<') return(NULL);
    NEXT1;

    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
	     "xmlParseStartTag: invalid element name\n");
        return(NULL);
    }

    /*
     * Now parse the attributes, it ends up with the ending
     *
     * (S Attribute)* S?
     */
    SKIP_BLANKS;
    GROW;

    while (((RAW != '>') &&
	   ((RAW != '/') || (NXT(1) != '>')) &&
	   (IS_BYTE_CHAR(RAW))) && (ctxt->instate != XML_PARSER_EOF)) {
	const xmlChar *q = CUR_PTR;
	unsigned int cons = ctxt->input->consumed;

	attname = xmlParseAttribute(ctxt, &attvalue);
        if ((attname != NULL) && (attvalue != NULL)) {
	    /*
	     * [ WFC: Unique Att Spec ]
	     * No attribute name may appear more than once in the same
	     * start-tag or empty-element tag.
	     */
	    for (i = 0; i < nbatts;i += 2) {
	        if (xmlStrEqual(atts[i], attname)) {
		    xmlErrAttributeDup(ctxt, NULL, attname);
		    xmlFree(attvalue);
		    goto failed;
		}
	    }
	    /*
	     * Add the pair to atts
	     */
	    if (atts == NULL) {
	        maxatts = 22; /* allow for 10 attrs by default */
	        atts = (const xmlChar **)
		       xmlMalloc(maxatts * sizeof(xmlChar *));
		if (atts == NULL) {
		    xmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    } else if (nbatts + 4 > maxatts) {
	        const xmlChar **n;

	        maxatts *= 2;
	        n = (const xmlChar **) xmlRealloc((void *) atts,
					     maxatts * sizeof(const xmlChar *));
		if (n == NULL) {
		    xmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		atts = n;
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    }
	    atts[nbatts++] = attname;
	    atts[nbatts++] = attvalue;
	    atts[nbatts] = NULL;
	    atts[nbatts + 1] = NULL;
	} else {
	    if (attvalue != NULL)
		xmlFree(attvalue);
	}

failed:

	GROW
	if ((RAW == '>') || (((RAW == '/') && (NXT(1) == '>'))))
	    break;
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "attributes construct error\n");
	}
        if ((cons == ctxt->input->consumed) && (q == CUR_PTR) &&
            (attname == NULL) && (attvalue == NULL)) {
	    xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
			   "xmlParseStartTag: problem parsing attributes\n");
	    break;
	}
	SHRINK;
        GROW;
    }

    /*
     * SAX: Start of Element !
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL) &&
	(!ctxt->disableSAX)) {
	if (nbatts > 0)
	    ctxt->sax->startElement(ctxt->userData, name, atts);
	else
	    ctxt->sax->startElement(ctxt->userData, name, NULL);
    }

    if (atts != NULL) {
        /* Free only the content strings */
        for (i = 1;i < nbatts;i+=2)
	    if (atts[i] != NULL)
	       xmlFree((xmlChar *) atts[i]);
    }
    return(name);
}